

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_pbsload(dill_stream s,int type,int junk,int dest,int src1,int src2)

{
  ulong uVar1;
  int in_ECX;
  uint in_ESI;
  undefined8 in_RDI;
  uint in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int ltype;
  int fdest;
  int rex;
  int in_stack_ffffffffffffffd0;
  uint dest_00;
  uint typ;
  uint uVar2;
  undefined4 uVar3;
  int local_14;
  
  if (in_ESI == 9) {
    typ = 4;
    local_14 = 0;
  }
  else {
    typ = in_ESI;
    local_14 = in_ECX;
    if (in_ESI == 10) {
      typ = 6;
      local_14 = 0;
    }
  }
  uVar2 = (uint)(7 < local_14);
  dest_00 = in_ESI;
  x86_64_pload(_ltype,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
               (int)((ulong)in_RDI >> 0x20));
  uVar1 = (ulong)in_ESI;
  switch(uVar1) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
    BYTE_OUT2R((dill_stream)CONCAT44(in_R9D,uVar2),in_ECX,typ,dest_00);
    x86_64_rshi((dill_stream)CONCAT44(dest_00,in_stack_ffffffffffffffd0),(int)(uVar1 >> 0x20),
                (int)uVar1,0);
    break;
  case 6:
  case 7:
  case 8:
    uVar2 = uVar2 | 8;
  case 4:
  case 5:
    BYTE_OUT2R((dill_stream)CONCAT44(in_R9D,uVar2),in_ECX,typ,dest_00);
    break;
  case 9:
    uVar2 = 0;
    x86_64_bswap((dill_stream)((ulong)in_R9D << 0x20),in_ECX,typ,dest_00,in_stack_ffffffffffffffd0);
    if (7 < in_ECX) {
      uVar2 = uVar2 | 4;
    }
    BYTE_OUT1R3((dill_stream)CONCAT44(in_R9D,uVar2),in_ECX,typ,dest_00,in_stack_ffffffffffffffd0,
                (int)(uVar1 >> 0x20));
    break;
  case 10:
    uVar3 = 8;
    if (7 < in_ECX) {
      uVar3 = 0xc;
    }
    x86_64_bswap((dill_stream)CONCAT44(in_R9D,uVar3),in_ECX,typ,dest_00,in_stack_ffffffffffffffd0);
    BYTE_OUT1R3((dill_stream)CONCAT44(in_R9D,uVar3),in_ECX,typ,dest_00,in_stack_ffffffffffffffd0,
                (int)(uVar1 >> 0x20));
  }
  return;
}

Assistant:

extern void
x86_64_pbsload(dill_stream s, int type, int junk, int dest, int src1, int src2)
{
    int rex = 0;
    int fdest = dest;
    int ltype = type;
    switch (type) {
    case DILL_D:
        ltype = DILL_L;
        fdest = dest;
        dest = EAX;
        break;
    case DILL_F:
        ltype = DILL_I;
        fdest = dest;
        dest = EAX;
        break;
    }
    if (dest > RDI)
        rex |= REX_B;
    x86_64_pload(s, ltype, junk, dest, src1, src2);
    switch (type) {
    case DILL_F:
        rex = 0;
        x86_64_bswap(s, 0, DILL_I, EAX, EAX);
        if (fdest > RDI)
            rex |= REX_R;
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_D:
        rex = REX_W;
        if (fdest > RDI)
            rex |= REX_R;
        x86_64_bswap(s, 0, DILL_L, EAX, EAX);
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
        rex |= REX_W;
    case DILL_I:
    case DILL_U:
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        break;
    case DILL_S:
    case DILL_US:
        /* byteswap 32 bits and shift down 16 */
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        x86_64_rshi(s, dest, dest, 16);
        break;
    case DILL_C:
    case DILL_UC:
        break;
    }
}